

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O1

void __thiscall CornellBox::CornellBox(CornellBox *this)

{
  tmat4x4<float> Result_2;
  tmat4x4<float> Result_1;
  tmat4x4<float> Result;
  ColorRGB local_178;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_168;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_128;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_e8;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  tmat4x4<float> local_a0;
  mat4 local_60;
  
  local_e8.field_0.x = 1.0;
  local_e8.field_0.y = 0.0;
  local_e8.field_0.z = 0.0;
  local_e8.field_0.w = 0.0;
  local_d8 = 0;
  uStack_d4 = 0x3f800000;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0x3f800000;
  uStack_bc = 0;
  local_b8 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0xc2200000;
  uStack_ac = 0x3f800000;
  local_128.field_0.x = 20.0;
  local_128.field_0.y = 0.0;
  local_128.field_0.z = 0.0;
  local_128.field_0.w = 0.0;
  local_118 = 0;
  uStack_114 = 0x41a00000;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0x41a00000;
  uStack_fc = 0;
  local_f8 = 0;
  uStack_f4 = 0;
  uStack_f0 = 0;
  uStack_ec = 0x3f800000;
  glm::detail::operator*((tmat4x4<float> *)&local_e8.field_0,(tmat4x4<float> *)&local_128.field_0);
  local_168.field_0.x = 1.0;
  local_168.field_0.y = 0.0;
  local_168.field_0.z = 0.0;
  local_168.field_0.w = 0.0;
  local_158 = 0;
  uStack_154 = 0x3f800000;
  uStack_150 = 0;
  local_148 = 0;
  uStack_140 = 0x3f800000;
  uStack_13c = 0;
  local_138 = 0xbf000000;
  uStack_134 = 0xbf000000;
  uStack_130 = 0x3f000000;
  uStack_12c = 0x3f800000;
  glm::detail::operator*(&local_a0,(tmat4x4<float> *)&local_168.field_0);
  ColorRGB::ColorRGB(&local_178);
  SceneObject::SceneObject(&this->super_SceneObject,&local_60,local_178);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR__CornellBox_0010ccc8;
  memset(&this->triangles,0,0xa8);
  _calculateGeometry(this);
  return;
}

Assistant:

CornellBox::CornellBox() : 
    SceneObject(
        glm::translate<float>(0, 0, -40) *
        glm::scale<float>(20, 20, 20) *
        glm::translate<float>(-0.5, -0.5, 0.5),
        ColorRGB()) {
    _calculateGeometry();
}